

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpv(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *nulval,void *array,
         int *anynul,int *status)

{
  void *array_local;
  void *nulval_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (nelem != 0)) {
    if (datatype == 0xb) {
      if (nulval == (void *)0x0) {
        ffgpvb(fptr,1,firstelem,nelem,'\0',(uchar *)array,anynul,status);
      }
      else {
        ffgpvb(fptr,1,firstelem,nelem,*nulval,(uchar *)array,anynul,status);
      }
    }
    else if (datatype == 0xc) {
      if (nulval == (void *)0x0) {
        ffgpvsb(fptr,1,firstelem,nelem,'\0',(char *)array,anynul,status);
      }
      else {
        ffgpvsb(fptr,1,firstelem,nelem,*nulval,(char *)array,anynul,status);
      }
    }
    else if (datatype == 0x14) {
      if (nulval == (void *)0x0) {
        ffgpvui(fptr,1,firstelem,nelem,0,(unsigned_short *)array,anynul,status);
      }
      else {
        ffgpvui(fptr,1,firstelem,nelem,*nulval,(unsigned_short *)array,anynul,status);
      }
    }
    else if (datatype == 0x15) {
      if (nulval == (void *)0x0) {
        ffgpvi(fptr,1,firstelem,nelem,0,(short *)array,anynul,status);
      }
      else {
        ffgpvi(fptr,1,firstelem,nelem,*nulval,(short *)array,anynul,status);
      }
    }
    else if (datatype == 0x1e) {
      if (nulval == (void *)0x0) {
        ffgpvuk(fptr,1,firstelem,nelem,0,(uint *)array,anynul,status);
      }
      else {
        ffgpvuk(fptr,1,firstelem,nelem,*nulval,(uint *)array,anynul,status);
      }
    }
    else if (datatype == 0x1f) {
      if (nulval == (void *)0x0) {
        ffgpvk(fptr,1,firstelem,nelem,0,(int *)array,anynul,status);
      }
      else {
        ffgpvk(fptr,1,firstelem,nelem,*nulval,(int *)array,anynul,status);
      }
    }
    else if (datatype == 0x28) {
      if (nulval == (void *)0x0) {
        ffgpvuj(fptr,1,firstelem,nelem,0,(unsigned_long *)array,anynul,status);
      }
      else {
        ffgpvuj(fptr,1,firstelem,nelem,*nulval,(unsigned_long *)array,anynul,status);
      }
    }
    else if (datatype == 0x29) {
      if (nulval == (void *)0x0) {
        ffgpvj(fptr,1,firstelem,nelem,0,(long *)array,anynul,status);
      }
      else {
        ffgpvj(fptr,1,firstelem,nelem,*nulval,(long *)array,anynul,status);
      }
    }
    else if (datatype == 0x50) {
      if (nulval == (void *)0x0) {
        ffgpvujj(fptr,1,firstelem,nelem,0,(ULONGLONG *)array,anynul,status);
      }
      else {
        ffgpvujj(fptr,1,firstelem,nelem,*nulval,(ULONGLONG *)array,anynul,status);
      }
    }
    else if (datatype == 0x51) {
      if (nulval == (void *)0x0) {
        ffgpvjj(fptr,1,firstelem,nelem,0,(LONGLONG *)array,anynul,status);
      }
      else {
        ffgpvjj(fptr,1,firstelem,nelem,*nulval,(LONGLONG *)array,anynul,status);
      }
    }
    else if (datatype == 0x2a) {
      if (nulval == (void *)0x0) {
        ffgpve(fptr,1,firstelem,nelem,0.0,(float *)array,anynul,status);
      }
      else {
        ffgpve(fptr,1,firstelem,nelem,*nulval,(float *)array,anynul,status);
      }
    }
    else if (datatype == 0x52) {
      if (nulval == (void *)0x0) {
        ffgpvd(fptr,1,firstelem,nelem,0.0,(double *)array,anynul,status);
      }
      else {
        ffgpvd(fptr,1,firstelem,nelem,*nulval,(double *)array,anynul,status);
      }
    }
    else {
      *status = 0x19a;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG firstelem,   /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgpvb(fptr, 1, firstelem, nelem, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgpvb(fptr, 1, firstelem, nelem, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgpvsb(fptr, 1, firstelem, nelem, 0,
               (signed char *) array, anynul, status);
      else
        ffgpvsb(fptr, 1, firstelem, nelem, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgpvui(fptr, 1, firstelem, nelem, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgpvui(fptr, 1, firstelem, nelem, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgpvi(fptr, 1, firstelem, nelem, 0,
               (short *) array, anynul, status);
      else
        ffgpvi(fptr, 1, firstelem, nelem, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgpvuk(fptr, 1, firstelem, nelem, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgpvuk(fptr, 1, firstelem, nelem, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgpvk(fptr, 1, firstelem, nelem, 0,
               (int *) array, anynul, status);
      else
        ffgpvk(fptr, 1, firstelem, nelem, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgpvuj(fptr, 1, firstelem, nelem, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgpvuj(fptr, 1, firstelem, nelem, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgpvj(fptr, 1, firstelem, nelem, 0,
               (long *) array, anynul, status);
      else
        ffgpvj(fptr, 1, firstelem, nelem, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgpvujj(fptr, 1, firstelem, nelem, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgpvujj(fptr, 1, firstelem, nelem, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgpvjj(fptr, 1, firstelem, nelem, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgpvjj(fptr, 1, firstelem, nelem, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgpve(fptr, 1, firstelem, nelem, 0,
               (float *) array, anynul, status);
      else
        ffgpve(fptr, 1, firstelem, nelem, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgpvd(fptr, 1, firstelem, nelem, 0,
               (double *) array, anynul, status);
      else
      {
        ffgpvd(fptr, 1, firstelem, nelem, *(double *) nulval,
               (double *) array, anynul, status);
      }
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}